

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O2

size_t Diligent::GetPrintWidth<unsigned_int>(uint Num,uint Base)

{
  size_t sVar1;
  
  if (Num == 0) {
    sVar1 = 1;
  }
  else {
    sVar1 = 0;
    for (; Num != 0; Num = Num / Base) {
      sVar1 = sVar1 + 1;
    }
  }
  return sVar1;
}

Assistant:

size_t GetPrintWidth(Type Num, Type Base = 10)
{
    if (Num == 0)
        return 1;

    size_t W = Num < 0 ? 1 : 0;
    while (Num != 0)
    {
        ++W;
        Num /= Base;
    }

    return W;
}